

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

int __thiscall
CConsole::ParseCommandArgs
          (CConsole *this,char *pArgs,char *pFormat,FCommandCallback pfnCallback,void *pContext)

{
  long lVar1;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffeae8;
  char *in_stack_ffffffffffffeaf0;
  int Error;
  undefined4 uStack_14ec;
  CConsole *in_stack_ffffffffffffeb18;
  void *pContext_local;
  FCommandCallback pfnCallback_local;
  char *pFormat_local;
  char *pArgs_local;
  CConsole *this_local;
  int local_14b4;
  CResult Result;
  
  Result.m_apArgs[1] = (char *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CResult::CResult((CResult *)this);
  str_copy(in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeae8,0);
  Result.m_pArgsStart = Result.m_aStringStorage;
  local_14b4 = ParseArgs(in_stack_ffffffffffffeb18,(CResult *)CONCAT44(uStack_14ec,Error),
                         (char *)pfnCallback);
  if (local_14b4 == 0) {
    if (pfnCallback != (FCommandCallback)0x0) {
      (*pfnCallback)(&Result.super_IResult,pContext);
    }
    local_14b4 = 0;
  }
  CResult::~CResult((CResult *)0x13b0a1);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14b4;
}

Assistant:

int CConsole::ParseCommandArgs(const char *pArgs, const char *pFormat, FCommandCallback pfnCallback, void *pContext)
{
	CResult Result;
	str_copy(Result.m_aStringStorage, pArgs, sizeof(Result.m_aStringStorage));
	Result.m_pArgsStart = Result.m_aStringStorage;

	int Error = ParseArgs(&Result, pFormat);
	if(Error)
		return Error;

	if(pfnCallback)
		pfnCallback(&Result, pContext);

	return 0;
}